

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

ostream * operator<<(ostream *o,LinkedToken *t)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"[token: ",8);
  poVar1 = operator<<(o,&t->token);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", url: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(t->link)._M_dataplus._M_p,(t->link)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const LinkedToken& t) {
        return o << "[token: " << t.token << ", url: " << t.link << "]";
    }